

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall wasm::TranslateToFuzzReader::fixAfterChanges::Fixer::replace(Fixer *this)

{
  Function *pFVar1;
  Expression *pEVar2;
  ulong uVar3;
  _Hash_node_base *p_Var4;
  Expression *in_RAX;
  Expression *pEVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  Expression **ppEVar8;
  ulong uVar9;
  __node_base_ptr p_Var10;
  __node_base_ptr p_Var11;
  _Hash_node_base *p_Var12;
  Expression *local_38;
  
  local_38 = in_RAX;
  pEVar5 = makeTrivial(this->parent,
                       (Type)((*(this->
                                super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>
                                ).
                                super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>
                                .super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
                                replacep)->type).id);
  pFVar1 = (this->super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>).
           super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
           super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.currFunction;
  if ((pFVar1 != (Function *)0x0) &&
     (pEVar2 = *(this->
                super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>).
                super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
                super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.replacep,
     local_38 = pEVar5, (pFVar1->debugLocations)._M_h._M_element_count != 0)) {
    sVar6 = std::
            _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(&(pFVar1->debugLocations)._M_h,&local_38);
    if (sVar6 == 0) {
      uVar3 = (pFVar1->debugLocations)._M_h._M_bucket_count;
      uVar9 = (ulong)pEVar2 % uVar3;
      p_Var10 = (pFVar1->debugLocations)._M_h._M_buckets[uVar9];
      p_Var11 = (__node_base_ptr)0x0;
      if ((p_Var10 != (__node_base_ptr)0x0) &&
         (p_Var12 = p_Var10->_M_nxt, p_Var11 = p_Var10,
         (Expression *)p_Var10->_M_nxt[1]._M_nxt != pEVar2)) {
        while (p_Var10 = p_Var12, p_Var12 = p_Var10->_M_nxt, p_Var12 != (_Hash_node_base *)0x0) {
          p_Var11 = (__node_base_ptr)0x0;
          if (((ulong)p_Var12[1]._M_nxt % uVar3 != uVar9) ||
             (p_Var11 = p_Var10, (Expression *)p_Var12[1]._M_nxt == pEVar2)) goto LAB_00147fba;
        }
        p_Var11 = (__node_base_ptr)0x0;
      }
LAB_00147fba:
      if (p_Var11 == (__node_base_ptr)0x0) {
        p_Var12 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var12 = p_Var11->_M_nxt;
      }
      if (p_Var12 != (_Hash_node_base *)0x0) {
        pmVar7 = std::__detail::
                 _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&pFVar1->debugLocations,&local_38);
        p_Var4 = p_Var12[3]._M_nxt;
        *(_Hash_node_base **)
         &(pmVar7->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload.
          super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload = p_Var12[2]._M_nxt
        ;
        *(_Hash_node_base **)
         ((long)&(pmVar7->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                 _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload +
         8) = p_Var4;
        *(_Hash_node_base **)
         ((long)&(pmVar7->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                 _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload.
                 _M_value.symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>._M_payload
         + 4) = p_Var12[4]._M_nxt;
      }
    }
  }
  *(this->super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>).
   super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
   super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.replacep = pEVar5;
  ppEVar8 = SmallVector<wasm::Expression_*,_10UL>::back
                      (&(this->
                        super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>
                        ).expressionStack);
  *ppEVar8 = pEVar5;
  return;
}

Assistant:

void replace() { replaceCurrent(parent.makeTrivial(getCurrent()->type)); }